

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-term.c
# Opt level: O1

errr term_nuke(term *t)

{
  if (t->active_flag == true) {
    if (t->nuke_hook != (_func_void_term_ptr *)0x0) {
      (*t->nuke_hook)(t);
    }
    t->active_flag = false;
    t->mapped_flag = false;
  }
  term_win_nuke(t->old);
  mem_free(t->old);
  term_win_nuke(t->scr);
  mem_free(t->scr);
  if (t->mem != (term_win *)0x0) {
    term_win_nuke(t->mem);
    mem_free(t->mem);
  }
  if (t->tmp != (term_win *)0x0) {
    term_win_nuke(t->tmp);
    mem_free(t->tmp);
  }
  mem_free(t->x1);
  mem_free(t->x2);
  mem_free(t->key_queue);
  return 0;
}

Assistant:

errr term_nuke(term *t)
{
	/* Hack -- Call the special "nuke" hook */
	if (t->active_flag) {
		/* Call the "nuke" hook */
		if (t->nuke_hook) (*t->nuke_hook)(t);

		/* Remember */
		t->active_flag = false;

		/* Assume not mapped */
		t->mapped_flag = false;
	}


	/* Nuke "displayed" */
	term_win_nuke(t->old);

	/* Kill "displayed" */
	mem_free(t->old);

	/* Nuke "requested" */
	term_win_nuke(t->scr);

	/* Kill "requested" */
	mem_free(t->scr);

	/* If needed */
	if (t->mem) {
		/* Nuke "memorized" */
		term_win_nuke(t->mem);

		/* Kill "memorized" */
		mem_free(t->mem);
	}

	/* If needed */
	if (t->tmp) {
		/* Nuke "temporary" */
		term_win_nuke(t->tmp);

		/* Kill "temporary" */
		mem_free(t->tmp);
	}

	/* Free some arrays */
	mem_free(t->x1);
	mem_free(t->x2);

	/* Free the input queue */
	mem_free(t->key_queue);

	/* Success */
	return (0);
}